

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O3

void UI::argument_mode(int *argc,char **argv)

{
  string_code sVar1;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  print_welcome();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,argv[1],&local_61);
  sVar1 = ARG_MODE::hashit(&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  switch(sVar1) {
  case e3DModel:
    gather_3D_arg(argc,argv);
    break;
  case eHelp:
    print_help();
    break;
  case eMeshops:
    gather_meshops_arg(argc,argv);
    break;
  case eModeling:
    gather_modeling_arg(argc,argv);
    break;
  case eSlice:
    gather_slice_arg((int *)local_40._M_dataplus._M_p,argv);
    break;
  case eVersion:
    print_version();
    break;
  default:
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Unrecognized input argument. Try \"-help\" or interactive mode."
               ,"");
    print_ln(&local_60);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void UI::argument_mode(int &argc, char *argv[])
{
    print_welcome();
    ARG_MODE::string_code input_arg = ARG_MODE::hashit(argv[1]);
    switch (input_arg)
    {
    case ARG_MODE::eHelp:
        print_help();
        break;
    case ARG_MODE::e3DModel:
        gather_3D_arg(argc,argv);
        break;
    case ARG_MODE::eMeshops:
        gather_meshops_arg(argc, argv);
        break;
    case ARG_MODE::eModeling:
        gather_modeling_arg(argc, argv);
        break;
    case ARG_MODE::eSlice:
        gather_slice_arg(argc, argv);
        break;
    case ARG_MODE::eVersion:
        print_version();
        break;
    default:
        print_ln("Unrecognized input argument. Try \"-help\" or interactive mode.");
        break;
    }
}